

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O1

string<unsigned_long> __thiscall
irr::core::string<unsigned_long>::subString(string<unsigned_long> *this,s32 begin,s32 length)

{
  unsigned_long *puVar1;
  uint in_ECX;
  ulong uVar2;
  ulong extraout_RDX;
  undefined4 in_register_00000034;
  string<unsigned_long> sVar3;
  
  if ((int)in_ECX < 1) {
    this->array = (unsigned_long *)0x0;
    this->allocated = 0;
    this->used = 0;
    operator=(this,"");
    uVar2 = extraout_RDX;
  }
  else {
    this->array = (unsigned_long *)0x0;
    this->allocated = 1;
    this->used = 1;
    puVar1 = (unsigned_long *)operator_new__(8);
    this->array = puVar1;
    *puVar1 = 0;
    reallocate(this,in_ECX + 1);
    uVar2 = 0;
    do {
      this->array[uVar2] =
           *(unsigned_long *)
            (*(long *)CONCAT44(in_register_00000034,begin) + (long)length * 8 + uVar2 * 8);
      uVar2 = uVar2 + 1;
    } while (in_ECX != uVar2);
    this->array[in_ECX] = 0;
    this->used = this->allocated;
  }
  sVar3.allocated = (int)uVar2;
  sVar3.used = (int)(uVar2 >> 0x20);
  sVar3.array = (unsigned_long *)this;
  return sVar3;
}

Assistant:

string<T> subString(s32 begin, s32 length)
	{
		if (length <= 0)
			return string<T>("");

		string<T> o;
		o.reserve(length+1);

		for (s32 i=0; i<length; ++i)
			o.array[i] = array[i+begin];

		o.array[length] = 0;
		o.used = o.allocated;

		return o;
	}